

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::Read<tcu::Vector<int,4>>
          (BasicAllFormatsLoadStoreComputeStage *this,GLenum internalformat,Vector<int,_4> *value,
          Vector<int,_4> *expected_value)

{
  ulong uVar1;
  bool bVar2;
  GLuint shader;
  GLuint program;
  GLint GVar3;
  ostream *poVar4;
  GLenum GVar5;
  ulong uVar6;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  ivec4 *b;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  char *pcVar7;
  CallLogWrapper *this_00;
  GLuint texture [2];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  string local_268;
  string local_248;
  char *src;
  string source;
  vec4 zero;
  Vector<int,_4> local_1c8;
  Vector<int,_4> local_1b8;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar4 = std::operator<<((ostream *)&os,
                           "#version 420 core\n#extension GL_ARB_compute_shader : require\nlayout(local_size_x = 1) in;\nlayout("
                          );
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_248,(void *)(ulong)internalformat,e);
  poVar4 = std::operator<<(poVar4,(string *)&local_248);
  pcVar7 = ") readonly uniform ";
  poVar4 = std::operator<<(poVar4,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_268,pcVar7);
  poVar4 = std::operator<<(poVar4,(string *)&local_268);
  poVar4 = std::operator<<(poVar4,"image2D g_image_read;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            ((string *)&data,(void *)(ulong)internalformat,e_00);
  poVar4 = std::operator<<(poVar4,(string *)&data);
  pcVar7 = ") writeonly uniform ";
  poVar4 = std::operator<<(poVar4,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>((string *)&zero,pcVar7);
  poVar4 = std::operator<<(poVar4,(string *)&zero);
  pcVar7 = 
  "image2D g_image_write;\nvoid main() {\n  ivec2 coord = ivec2(int(gl_GlobalInvocationID.x), 0);\n  "
  ;
  poVar4 = std::operator<<(poVar4,
                           "image2D g_image_write;\nvoid main() {\n  ivec2 coord = ivec2(int(gl_GlobalInvocationID.x), 0);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>((string *)&src,pcVar7);
  poVar4 = std::operator<<(poVar4,(string *)&src);
  std::operator<<(poVar4,
                  "vec4 v = imageLoad(g_image_read, coord);\n  imageStore(g_image_write, coord, v);\n}"
                 );
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::~string((string *)&zero);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  src = source._M_dataplus._M_p;
  this_00 = (CallLogWrapper *)(this + 8);
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&src,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&data,1,value,(allocator_type *)&os);
  glu::CallLogWrapper::glGenTextures(this_00,2,texture);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[0]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,internalformat,1,1,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zero,0.0);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,internalformat,1,1,0,0x8d99,0x1404,(string *)&zero);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_read");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_write");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,texture[0],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,texture[1],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 2) {
      glu::CallLogWrapper::glDeleteTextures(this_00,2,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      goto LAB_00a3a93d;
    }
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[uVar6]);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    GVar5 = 0x8d99;
    glu::CallLogWrapper::glGetTexImage
              (this_00,0xde1,0,0x8d99,0x1404,
               data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    bVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)
                       data.
                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,expected_value,b,GVar5);
    uVar1 = uVar6 + 1;
  } while (bVar2);
  glu::CallLogWrapper::glDeleteTextures(this_00,4,texture);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  tcu::Vector<int,_4>::Vector
            (&local_1b8,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>((string *)&os,&local_1b8,v);
  tcu::Vector<int,_4>::Vector(&local_1c8,expected_value);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_248,&local_1c8,v_00);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_268,(void *)(ulong)internalformat,e_01);
  gl4cts::anon_unknown_0::Output
            ("Value is: %s. Value should be: %s. Format is: %s.\n",
             os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
             local_248._M_dataplus._M_p,local_268._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&os);
LAB_00a3a93d:
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
  std::__cxx11::string::~string((string *)&source);
  return 1 < uVar6;
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		GLuint			  program;
		std::string		  source = GenCS<T>(internalformat);
		const char* const src	= source.c_str();
		GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
		glShaderSource(sh, 1, &src, NULL);
		glCompileShader(sh);
		program = glCreateProgram();
		glAttachShader(program, sh);
		glLinkProgram(program);
		glDeleteShader(sh);

		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize, value);
		GLuint		   texture[2];
		glGenTextures(2, texture);

		glBindTexture(GL_TEXTURE_2D, texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		vec4 zero(0);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &zero);

		glBindTexture(GL_TEXTURE_2D, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_read"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_write"), 1);

		glBindImageTexture(0, texture[0], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(1, texture[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glDispatchCompute(1, 1, 1);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, texture[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, Format<T>(), Type<T>(), &data[0]);

			if (!Equal(data[0], expected_value, internalformat))
			{
				glDeleteTextures(4, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Value is: %s. Value should be: %s. Format is: %s.\n", ToString(data[0]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str());
				return false;
			}
		}
		glDeleteTextures(2, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}